

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O3

void __thiscall
timertt::details::
timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
::~timer_heap_engine
          (timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
           *this)

{
  function<void_(const_std::exception_&)> *pfVar1;
  pointer pptVar2;
  _Manager_type p_Var3;
  
  clear_all(this);
  pptVar2 = (this->m_heap).
            super__Vector_base<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*,_std::allocator<timertt::details::timer_heap_engine<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>::timer_type_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pptVar2 != (pointer)0x0) {
    operator_delete(pptVar2);
  }
  p_Var3 = (this->
           super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
           ).m_exception_handler.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    pfVar1 = &(this->
              super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
              ).m_exception_handler;
    (*p_Var3)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  p_Var3 = (this->
           super_engine_common<timertt::thread_safety::unsafe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
           ).m_error_logger.super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  return;
}

Assistant:

~timer_heap_engine()
	{
		clear_all();
	}